

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

VariableValue * __thiscall rsg::VariableValue::operator=(VariableValue *this,VariableValue *other)

{
  Variable *type;
  StridedValueAccess<1> local_38;
  StridedValueRead<1> local_28;
  
  type = other->m_variable;
  this->m_variable = type;
  ValueStorage<1>::setStorage(&this->m_storage,&type->m_type);
  local_28.m_type = &other->m_variable->m_type;
  local_28.m_value =
       (other->m_storage).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super_ConstStridedValueAccess<1>.m_type = &this->m_variable->m_type;
  local_38.super_ConstStridedValueAccess<1>.m_value =
       (this->m_storage).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
       _M_impl.super__Vector_impl_data._M_start;
  StridedValueAccess<1>::operator=(&local_38,&local_28);
  return this;
}

Assistant:

VariableValue& VariableValue::operator= (const VariableValue& other)
{
	m_variable	= other.m_variable;
	m_storage.setStorage(getType());
	m_storage.getValue(getType()) = other.getValue().value();
	return *this;
}